

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void __thiscall
toml::
result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
::cleanup(result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
          *this,EVP_PKEY_CTX *ctx)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if (this->is_ok_ != true) {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)&(this->field_1).succ_);
    return;
  }
  if (*(char *)((long)&this->field_1 + 0x20) == '\x01') {
    *(undefined1 *)((long)&this->field_1 + 0x20) = 0;
    pcVar1 = (this->field_1).fail_.value.title_._M_dataplus._M_p;
    paVar2 = &(this->field_1).fail_.value.title_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != paVar2) {
      operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
      return;
    }
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }